

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O3

void __thiscall
duckdb::WriteOverflowStringsToDisk::AllocateNewBlock
          (WriteOverflowStringsToDisk *this,UncompressedStringSegmentState *state,
          block_id_t new_block_id)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  BlockManager *manager_p;
  
  if (this->block_id != -1) {
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
    pdVar1 = ((this->handle).node.ptr)->buffer;
    iVar2 = GetStringSpace(this);
    *(block_id_t *)(pdVar1 + iVar2) = new_block_id;
    (*(this->super_OverflowStringWriter)._vptr_OverflowStringWriter[3])(this);
  }
  this->offset = 0;
  this->block_id = new_block_id;
  manager_p = PartialBlockManager::GetBlockManager(this->partial_block_manager);
  UncompressedStringSegmentState::RegisterBlock(state,manager_p,new_block_id);
  return;
}

Assistant:

void WriteOverflowStringsToDisk::AllocateNewBlock(UncompressedStringSegmentState &state, block_id_t new_block_id) {
	if (block_id != INVALID_BLOCK) {
		// there is an old block, write it first
		// write the new block id at the end of the previous block
		Store<block_id_t>(new_block_id, handle.Ptr() + GetStringSpace());
		Flush();
	}
	offset = 0;
	block_id = new_block_id;
	auto &block_manager = partial_block_manager.GetBlockManager();
	state.RegisterBlock(block_manager, new_block_id);
}